

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceTextModuleRecord.cpp
# Opt level: O0

void __thiscall Js::SourceTextModuleRecord::GenerateRootFunction(SourceTextModuleRecord *this)

{
  uint sourceIndex;
  ParseNodeProg *parseTree;
  Parser *parser;
  code *pcVar1;
  bool bVar2;
  ULONG grfscr;
  JavascriptFunction **ppJVar3;
  ScriptContext *scriptContext_00;
  undefined4 *puVar4;
  JavascriptLibrary *this_00;
  Utf8SourceInfo *pUVar5;
  SRCINFO *pSVar6;
  SourceTextModuleRecord *pSVar7;
  ParseNodeProg **ppPVar8;
  JavascriptFunction *pJVar9;
  char16 *sourceUrl_00;
  JavascriptError *ptr;
  DebugContext *this_01;
  FunctionBody *func;
  BaseDictionary<const_char16_t_*,_Js::SourceTextModuleRecord_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  **ppBVar10;
  BaseDictionary<const_char16_t_*,_Js::SourceTextModuleRecord_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar11;
  WCHAR *sourceUrl;
  undefined1 local_80 [8];
  CompileScriptException se;
  AutoDynamicCodeReference dynamicFunctionReference;
  ScriptContext *scriptContext;
  SourceTextModuleRecord *this_local;
  
  ppJVar3 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptFunction__
                      ((WriteBarrierPtr *)&this->rootFunction);
  if (*ppJVar3 == (JavascriptFunction *)0x0) {
    scriptContext_00 = GetScriptContext(this);
    AutoDynamicCodeReference::AutoDynamicCodeReference
              ((AutoDynamicCodeReference *)&se.bstrLine,scriptContext_00);
    CompileScriptException::CompileScriptException((CompileScriptException *)local_80);
    bVar2 = WasDeclarationInitialized(this);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                                  ,0x3b0,"(this->WasDeclarationInitialized())",
                                  "this->WasDeclarationInitialized()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    this_00 = ScriptContext::GetLibrary(scriptContext_00);
    pUVar5 = Memory::WriteBarrierPtr<Js::Utf8SourceInfo>::operator->(&this->pSourceInfo);
    pSVar6 = Utf8SourceInfo::GetSrcInfo(pUVar5);
    pSVar7 = JavascriptLibrary::GetModuleRecord(this_00,pSVar6->moduleID);
    if (this != pSVar7) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/SourceTextModuleRecord.cpp"
                                  ,0x3b1,
                                  "(this == scriptContext->GetLibrary()->GetModuleRecord(this->pSourceInfo->GetSrcInfo()->moduleID))"
                                  ,
                                  "this == scriptContext->GetLibrary()->GetModuleRecord(this->pSourceInfo->GetSrcInfo()->moduleID)"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    ppPVar8 = Memory::WriteBarrierPtr::operator_cast_to_ParseNodeProg__
                        ((WriteBarrierPtr *)&this->parseTree);
    parseTree = *ppPVar8;
    sourceIndex = this->sourceIndex;
    parser = this->parser;
    pUVar5 = Memory::WriteBarrierPtr<Js::Utf8SourceInfo>::operator->(&this->pSourceInfo);
    grfscr = Utf8SourceInfo::GetParseFlags(pUVar5);
    pJVar9 = ScriptContext::GenerateRootFunction
                       (scriptContext_00,parseTree,sourceIndex,parser,grfscr,
                        (CompileScriptException *)local_80,L"Module code");
    Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator=(&this->rootFunction,pJVar9);
    ReleaseParserResources(this);
    ppJVar3 = Memory::WriteBarrierPtr::operator_cast_to_JavascriptFunction__
                        ((WriteBarrierPtr *)&this->rootFunction);
    if (*ppJVar3 == (JavascriptFunction *)0x0) {
      sourceUrl_00 = GetSpecifierSz(this);
      ptr = JavascriptError::CreateFromCompileScriptException
                      (scriptContext_00,(CompileScriptException *)local_80,sourceUrl_00);
      Memory::WriteBarrierPtr<void>::operator=(&this->errorObject,ptr);
      Output::TraceWithFlush(ModulePhase,L"\t>NotifyParentAsNeeded rootFunction == nullptr\n");
      NotifyParentsAsNeeded(this);
    }
    else {
      this_01 = ScriptContext::GetDebugContext(scriptContext_00);
      pJVar9 = Memory::WriteBarrierPtr<Js::JavascriptFunction>::operator->(&this->rootFunction);
      func = JavascriptFunction::GetFunctionBody(pJVar9);
      DebugContext::RegisterFunction(this_01,&func->super_ParseableFunctionInfo,(LPCWSTR)0x0);
    }
    ppBVar10 = Memory::WriteBarrierPtr::operator_cast_to_BaseDictionary__
                         ((WriteBarrierPtr *)&this->childrenModuleSet);
    if (*ppBVar10 !=
        (BaseDictionary<const_char16_t_*,_Js::SourceTextModuleRecord_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
         *)0x0) {
      pBVar11 = Memory::
                WriteBarrierPtr<JsUtil::BaseDictionary<const_char16_t_*,_Js::SourceTextModuleRecord_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                ::operator->(&this->childrenModuleSet);
      JsUtil::
      BaseDictionary<char16_t_const*,Js::SourceTextModuleRecord*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::EachValue<Js::SourceTextModuleRecord::GenerateRootFunction()::__0>
                ((BaseDictionary<char16_t_const*,Js::SourceTextModuleRecord*,Memory::ArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)pBVar11);
    }
    CompileScriptException::~CompileScriptException((CompileScriptException *)local_80);
    AutoDynamicCodeReference::~AutoDynamicCodeReference((AutoDynamicCodeReference *)&se.bstrLine);
  }
  return;
}

Assistant:

void SourceTextModuleRecord::GenerateRootFunction()
    {
        // On cyclic dependency, we may end up generating the root function twice
        // so make sure we don't
        if (this->rootFunction != nullptr)
        {
            return;
        }

        ScriptContext* scriptContext = GetScriptContext();
        Js::AutoDynamicCodeReference dynamicFunctionReference(scriptContext);
        CompileScriptException se;

        Assert(this->WasDeclarationInitialized());
        Assert(this == scriptContext->GetLibrary()->GetModuleRecord(this->pSourceInfo->GetSrcInfo()->moduleID));

        this->rootFunction = scriptContext->GenerateRootFunction(parseTree, sourceIndex, this->parser, this->pSourceInfo->GetParseFlags(), &se, Constants::ModuleCode);

        // Parser uses a temporary guest arena to keep regex patterns alive. We need to release this arena only after we have no further use
        // for the regex pattern objects.
        this->ReleaseParserResources();

        if (rootFunction == nullptr)
        {
            const WCHAR * sourceUrl = this->GetSpecifierSz();

            this->errorObject = JavascriptError::CreateFromCompileScriptException(scriptContext, &se, sourceUrl);
            OUTPUT_TRACE_DEBUGONLY(Js::ModulePhase, _u("\t>NotifyParentAsNeeded rootFunction == nullptr\n"));
            NotifyParentsAsNeeded();
        }
#ifdef ENABLE_SCRIPT_DEBUGGING
        else
        {
            scriptContext->GetDebugContext()->RegisterFunction(this->rootFunction->GetFunctionBody(), nullptr);
        }
#endif
        if (childrenModuleSet != nullptr)
        {
            childrenModuleSet->EachValue([=](SourceTextModuleRecord* childModuleRecord)
            {
                childModuleRecord->GenerateRootFunction();
            });
        }
    }